

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_tec(REF_CAVITY ref_cavity,char *filename)

{
  REF_INT RVar1;
  REF_GRID pRVar2;
  REF_CELL pRVar3;
  REF_DBL *pRVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  FILE *__s;
  REF_LIST pRVar8;
  undefined8 uVar9;
  bool bVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  REF_DICT node_dict;
  REF_INT local;
  REF_DICT face_dict;
  REF_INT nodes [27];
  REF_DICT local_d8;
  int local_cc;
  REF_DICT local_c8;
  REF_GRID local_c0;
  REF_INT local_b4;
  long local_b0;
  REF_INT local_a8 [30];
  
  pRVar2 = ref_cavity->ref_grid;
  RVar1 = ref_cavity->node;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x837,
           "ref_cavity_tec","unable to open file");
    uVar6 = 2;
  }
  else {
    fwrite("title=\"tecplot refine cavity\"\n",0x1e,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"i\"\n",0x1c,1,__s);
    uVar6 = ref_dict_create(&local_d8);
    if (uVar6 == 0) {
      uVar6 = ref_dict_create(&local_c8);
      if (uVar6 == 0) {
        pRVar3 = pRVar2->cell[8];
        pRVar8 = ref_cavity->tet_list;
        local_c0 = pRVar2;
        local_b4 = RVar1;
        if (0 < pRVar8->n) {
          lVar13 = 0;
          do {
            RVar1 = pRVar8->value[lVar13];
            uVar6 = ref_dict_store(local_c8,RVar1,0);
            if (uVar6 != 0) {
              pcVar12 = "store";
              uVar9 = 0x842;
              goto LAB_001944d9;
            }
            uVar6 = ref_cell_nodes(pRVar3,RVar1,local_a8);
            if (uVar6 != 0) {
              pcVar12 = "nodes";
              uVar9 = 0x843;
              goto LAB_001944d9;
            }
            if (0 < pRVar3->node_per) {
              lVar11 = 0;
              do {
                uVar6 = ref_dict_store(local_d8,local_a8[lVar11],0);
                if (uVar6 != 0) {
                  pcVar12 = "store";
                  uVar9 = 0x845;
                  goto LAB_001944d9;
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 < pRVar3->node_per);
            }
            lVar13 = lVar13 + 1;
            pRVar8 = ref_cavity->tet_list;
          } while (lVar13 < pRVar8->n);
        }
        if ((0 < local_d8->n) && (0 < local_c8->n)) {
          fprintf(__s,"zone t=\"old-tet\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                  (ulong)(uint)local_d8->n,(ulong)(uint)local_c8->n,"point","fetetrahedron");
          pRVar2 = local_c0;
          if (0 < local_d8->n) {
            lVar13 = 0;
            do {
              local_cc = local_d8->key[lVar13];
              lVar11 = (long)local_cc;
              pRVar4 = pRVar2->node->real;
              fprintf(__s," %.16e %.16e %.16e %d\n",pRVar4[lVar11 * 0xf],pRVar4[lVar11 * 0xf + 1],
                      pRVar4[lVar11 * 0xf + 2]);
              lVar13 = lVar13 + 1;
            } while (lVar13 < local_d8->n);
          }
          if (0 < local_c8->n) {
            lVar13 = 0;
            do {
              uVar6 = ref_cell_nodes(pRVar3,local_c8->key[lVar13],local_a8);
              if (uVar6 != 0) {
                pcVar12 = "nodes";
                uVar9 = 0x859;
                goto LAB_001944d9;
              }
              if (0 < pRVar3->node_per) {
                lVar11 = 0;
                do {
                  uVar6 = ref_dict_location(local_d8,local_a8[lVar11],&local_cc);
                  if (uVar6 != 0) {
                    pcVar12 = "ret";
                    uVar9 = 0x85b;
                    goto LAB_001944d9;
                  }
                  fprintf(__s," %d",(ulong)(local_cc + 1));
                  lVar11 = lVar11 + 1;
                } while (lVar11 < pRVar3->node_per);
              }
              fputc(10,__s);
              lVar13 = lVar13 + 1;
            } while (lVar13 < local_c8->n);
          }
        }
        uVar6 = ref_dict_free(local_c8);
        if (uVar6 == 0) {
          uVar6 = ref_dict_free(local_d8);
          if (uVar6 == 0) {
            uVar6 = ref_dict_create(&local_d8);
            if (uVar6 == 0) {
              uVar6 = ref_dict_create(&local_c8);
              if (uVar6 == 0) {
                uVar6 = ref_dict_store(local_d8,local_b4,0);
                if (uVar6 == 0) {
                  iVar7 = ref_cavity->maxface;
                  if (0 < iVar7) {
                    lVar13 = 0;
                    lVar11 = 0;
                    do {
                      if (ref_cavity->f2n[lVar11 * 3] != -1) {
                        uVar6 = ref_dict_store(local_c8,(REF_INT)lVar11,0);
                        if (uVar6 != 0) {
                          pcVar12 = "store";
                          uVar9 = 0x869;
                          goto LAB_001944d9;
                        }
                        lVar14 = 0;
                        do {
                          uVar6 = ref_dict_store(local_d8,*(REF_INT *)
                                                           ((long)ref_cavity->f2n +
                                                           lVar14 * 4 + lVar13),0);
                          if (uVar6 != 0) {
                            pcVar12 = "store";
                            uVar9 = 0x86d;
                            goto LAB_001944d9;
                          }
                          lVar14 = lVar14 + 1;
                        } while (lVar14 != 3);
                        iVar7 = ref_cavity->maxface;
                      }
                      lVar11 = lVar11 + 1;
                      lVar13 = lVar13 + 0xc;
                    } while (lVar11 < iVar7);
                  }
                  if ((0 < local_d8->n) && (0 < local_c8->n)) {
                    fprintf(__s,
                            "zone t=\"new-tet\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                            ,(ulong)(uint)local_d8->n,(ulong)(uint)local_c8->n,"point",
                            "fetetrahedron");
                    pRVar2 = local_c0;
                    if (0 < local_d8->n) {
                      lVar13 = 0;
                      do {
                        local_cc = local_d8->key[lVar13];
                        lVar11 = (long)local_cc;
                        pRVar4 = pRVar2->node->real;
                        fprintf(__s," %.16e %.16e %.16e %d\n",pRVar4[lVar11 * 0xf],
                                pRVar4[lVar11 * 0xf + 1],pRVar4[lVar11 * 0xf + 2]);
                        lVar13 = lVar13 + 1;
                      } while (lVar13 < local_d8->n);
                    }
                    if (0 < local_c8->n) {
                      local_b0 = 0;
                      do {
                        iVar7 = local_c8->key[local_b0];
                        uVar6 = ref_dict_location(local_d8,local_b4,&local_cc);
                        if (uVar6 != 0) {
                          pcVar12 = "center node";
                          uVar9 = 0x881;
                          goto LAB_001944d9;
                        }
                        fprintf(__s," %d",(ulong)(local_cc + 1));
                        lVar13 = 0;
                        do {
                          uVar6 = ref_dict_location(local_d8,ref_cavity->f2n
                                                             [(long)iVar7 * 3 + lVar13],&local_cc);
                          if (uVar6 != 0) {
                            pcVar12 = "ret";
                            uVar9 = 0x886;
                            goto LAB_001944d9;
                          }
                          fprintf(__s," %d",(ulong)(local_cc + 1));
                          lVar13 = lVar13 + 1;
                        } while (lVar13 != 3);
                        fputc(10,__s);
                        local_b0 = local_b0 + 1;
                      } while (local_b0 < local_c8->n);
                    }
                  }
                  uVar6 = ref_dict_free(local_c8);
                  if (uVar6 == 0) {
                    uVar6 = ref_dict_free(local_d8);
                    if (uVar6 == 0) {
                      uVar6 = ref_dict_create(&local_d8);
                      if (uVar6 == 0) {
                        uVar6 = ref_dict_create(&local_c8);
                        if (uVar6 == 0) {
                          pRVar3 = local_c0->cell[3];
                          pRVar8 = ref_cavity->tri_list;
                          if (0 < pRVar8->n) {
                            lVar13 = 0;
                            do {
                              RVar1 = pRVar8->value[lVar13];
                              uVar6 = ref_dict_store(local_c8,RVar1,0);
                              if (uVar6 != 0) {
                                pcVar12 = "store";
                                uVar9 = 0x898;
                                goto LAB_001944d9;
                              }
                              uVar6 = ref_cell_nodes(pRVar3,RVar1,local_a8);
                              if (uVar6 != 0) {
                                pcVar12 = "nodes";
                                uVar9 = 0x899;
                                goto LAB_001944d9;
                              }
                              if (0 < pRVar3->node_per) {
                                lVar11 = 0;
                                do {
                                  uVar6 = ref_dict_store(local_d8,local_a8[lVar11],0);
                                  if (uVar6 != 0) {
                                    pcVar12 = "store";
                                    uVar9 = 0x89b;
                                    goto LAB_001944d9;
                                  }
                                  lVar11 = lVar11 + 1;
                                } while (lVar11 < pRVar3->node_per);
                              }
                              lVar13 = lVar13 + 1;
                              pRVar8 = ref_cavity->tri_list;
                            } while (lVar13 < pRVar8->n);
                          }
                          if ((0 < local_d8->n) && (0 < local_c8->n)) {
                            fprintf(__s,
                                    "zone t=\"old-tri\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                                    ,(ulong)(uint)local_d8->n,(ulong)(uint)local_c8->n,"point",
                                    "fetriangle");
                            if (0 < local_d8->n) {
                              lVar13 = 0;
                              do {
                                local_cc = local_d8->key[lVar13];
                                lVar11 = (long)local_cc;
                                pRVar4 = local_c0->node->real;
                                fprintf(__s," %.16e %.16e %.16e %d\n",pRVar4[lVar11 * 0xf],
                                        pRVar4[lVar11 * 0xf + 1],pRVar4[lVar11 * 0xf + 2]);
                                lVar13 = lVar13 + 1;
                              } while (lVar13 < local_d8->n);
                            }
                            if (0 < local_c8->n) {
                              lVar13 = 0;
                              do {
                                uVar6 = ref_cell_nodes(pRVar3,local_c8->key[lVar13],local_a8);
                                if (uVar6 != 0) {
                                  pcVar12 = "nodes";
                                  uVar9 = 0x8af;
                                  goto LAB_001944d9;
                                }
                                if (0 < pRVar3->node_per) {
                                  lVar11 = 0;
                                  do {
                                    uVar6 = ref_dict_location(local_d8,local_a8[lVar11],&local_cc);
                                    if (uVar6 != 0) {
                                      pcVar12 = "ret";
                                      uVar9 = 0x8b1;
                                      goto LAB_001944d9;
                                    }
                                    fprintf(__s," %d",(ulong)(local_cc + 1));
                                    lVar11 = lVar11 + 1;
                                  } while (lVar11 < pRVar3->node_per);
                                }
                                fputc(10,__s);
                                lVar13 = lVar13 + 1;
                              } while (lVar13 < local_c8->n);
                            }
                          }
                          uVar6 = ref_dict_free(local_c8);
                          if (uVar6 == 0) {
                            uVar6 = ref_dict_free(local_d8);
                            if (uVar6 == 0) {
                              uVar6 = ref_dict_create(&local_d8);
                              if (uVar6 == 0) {
                                uVar6 = ref_dict_create(&local_c8);
                                if (uVar6 == 0) {
                                  uVar6 = ref_dict_store(local_d8,local_b4,0);
                                  if (uVar6 == 0) {
                                    iVar7 = ref_cavity->maxseg;
                                    if (0 < iVar7) {
                                      lVar13 = 0;
                                      do {
                                        if (ref_cavity->s2n[lVar13 * 3] != -1) {
                                          uVar6 = ref_dict_store(local_c8,(REF_INT)lVar13,0);
                                          if (uVar6 != 0) {
                                            pcVar12 = "store";
                                            uVar9 = 0x8bf;
                                            goto LAB_001944d9;
                                          }
                                          lVar11 = 0;
                                          bVar5 = true;
                                          do {
                                            bVar10 = bVar5;
                                            uVar6 = ref_dict_store(local_d8,ref_cavity->s2n
                                                                            [lVar11 + lVar13 * 3],0)
                                            ;
                                            if (uVar6 != 0) {
                                              pcVar12 = "store";
                                              uVar9 = 0x8c3;
                                              goto LAB_001944d9;
                                            }
                                            lVar11 = 1;
                                            bVar5 = false;
                                          } while (bVar10);
                                          iVar7 = ref_cavity->maxseg;
                                        }
                                        lVar13 = lVar13 + 1;
                                      } while (lVar13 < iVar7);
                                    }
                                    if ((0 < local_d8->n) && (0 < local_c8->n)) {
                                      fprintf(__s,
                                              "zone t=\"new-tri\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                                              ,(ulong)(uint)local_d8->n,(ulong)(uint)local_c8->n,
                                              "point","fetriangle");
                                      if (0 < local_d8->n) {
                                        lVar13 = 0;
                                        do {
                                          local_cc = local_d8->key[lVar13];
                                          lVar11 = (long)local_cc;
                                          pRVar4 = local_c0->node->real;
                                          fprintf(__s," %.16e %.16e %.16e %d\n",pRVar4[lVar11 * 0xf]
                                                  ,pRVar4[lVar11 * 0xf + 1],pRVar4[lVar11 * 0xf + 2]
                                                 );
                                          lVar13 = lVar13 + 1;
                                        } while (lVar13 < local_d8->n);
                                      }
                                      if (0 < local_c8->n) {
                                        local_c0 = (REF_GRID)0x0;
                                        do {
                                          iVar7 = local_c8->key[(long)local_c0];
                                          uVar6 = ref_dict_location(local_d8,local_b4,&local_cc);
                                          if (uVar6 != 0) {
                                            pcVar12 = "center node";
                                            uVar9 = 0x8d7;
                                            goto LAB_001944d9;
                                          }
                                          fprintf(__s," %d",(ulong)(local_cc + 1));
                                          lVar13 = 0;
                                          bVar5 = true;
                                          do {
                                            bVar10 = bVar5;
                                            uVar6 = ref_dict_location(local_d8,ref_cavity->s2n
                                                                               [lVar13 + (long)iVar7
                                                                                         * 3],
                                                                      &local_cc);
                                            if (uVar6 != 0) {
                                              pcVar12 = "ret";
                                              uVar9 = 0x8dc;
                                              goto LAB_001944d9;
                                            }
                                            fprintf(__s," %d",(ulong)(local_cc + 1));
                                            lVar13 = 1;
                                            bVar5 = false;
                                          } while (bVar10);
                                          fputc(10,__s);
                                          local_c0 = (REF_GRID)((long)&local_c0->mpi + 1);
                                        } while ((long)local_c0 < (long)local_c8->n);
                                      }
                                    }
                                    uVar6 = ref_dict_free(local_c8);
                                    if (uVar6 == 0) {
                                      uVar6 = ref_dict_free(local_d8);
                                      if (uVar6 == 0) {
                                        fclose(__s);
                                        return 0;
                                      }
                                      pcVar12 = "free nodes";
                                      uVar9 = 0x8e4;
                                    }
                                    else {
                                      pcVar12 = "free face";
                                      uVar9 = 0x8e3;
                                    }
                                  }
                                  else {
                                    pcVar12 = "store";
                                    uVar9 = 0x8bd;
                                  }
                                }
                                else {
                                  pcVar12 = "create faces";
                                  uVar9 = 0x8bb;
                                }
                              }
                              else {
                                pcVar12 = "create nodes";
                                uVar9 = 0x8ba;
                              }
                            }
                            else {
                              pcVar12 = "free nodes";
                              uVar9 = 0x8b8;
                            }
                          }
                          else {
                            pcVar12 = "free tris";
                            uVar9 = 0x8b7;
                          }
                        }
                        else {
                          pcVar12 = "create faces";
                          uVar9 = 0x893;
                        }
                      }
                      else {
                        pcVar12 = "create nodes";
                        uVar9 = 0x892;
                      }
                    }
                    else {
                      pcVar12 = "free nodes";
                      uVar9 = 0x88e;
                    }
                  }
                  else {
                    pcVar12 = "free face";
                    uVar9 = 0x88d;
                  }
                }
                else {
                  pcVar12 = "store";
                  uVar9 = 0x867;
                }
              }
              else {
                pcVar12 = "create faces";
                uVar9 = 0x865;
              }
            }
            else {
              pcVar12 = "create nodes";
              uVar9 = 0x864;
            }
          }
          else {
            pcVar12 = "free nodes";
            uVar9 = 0x862;
          }
        }
        else {
          pcVar12 = "free tris";
          uVar9 = 0x861;
        }
      }
      else {
        pcVar12 = "create faces";
        uVar9 = 0x83d;
      }
    }
    else {
      pcVar12 = "create nodes";
      uVar9 = 0x83c;
    }
LAB_001944d9:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar9,
           "ref_cavity_tec",(ulong)uVar6,pcVar12);
  }
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_tec(REF_CAVITY ref_cavity, const char *filename) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_DICT node_dict, face_dict;
  REF_CELL ref_cell;
  REF_INT face, face_node, seg, seg_node;
  REF_INT cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local;
  REF_DBL xyz_phys[3];
  const char *zonetype;
  FILE *f;

  zonetype = "fetetrahedron";

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine cavity\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\" \"i\"\n");

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_list_item(ref_cavity_tet_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tet_list(ref_cavity), item);
    RSS(ref_dict_store(face_dict, cell, 0), "store");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"old-tet\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      cell = ref_dict_key(face_dict, item);
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }
  RSS(ref_dict_free(face_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  RSS(ref_dict_store(node_dict, node, 0), "store");
  each_ref_cavity_valid_face(ref_cavity, face) {
    RSS(ref_dict_store(face_dict, face, 0), "store");
    each_ref_cavity_face_node(ref_cavity, face_node) {
      RSS(ref_dict_store(node_dict, ref_cavity_f2n(ref_cavity, face_node, face),
                         0),
          "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"new-tet\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      face = ref_dict_key(face_dict, item);
      RSS(ref_dict_location(node_dict, node, &local), "center node");
      fprintf(f, " %d", local + 1);
      each_ref_cavity_face_node(ref_cavity, face_node) {
        RSS(ref_dict_location(
                node_dict, ref_cavity_f2n(ref_cavity, face_node, face), &local),
            "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }

  RSS(ref_dict_free(face_dict), "free face");
  RSS(ref_dict_free(node_dict), "free nodes");

  zonetype = "fetriangle";

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_dict_store(face_dict, cell, 0), "store");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"old-tri\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      cell = ref_dict_key(face_dict, item);
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }
  RSS(ref_dict_free(face_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  RSS(ref_dict_store(node_dict, node, 0), "store");
  each_ref_cavity_valid_seg(ref_cavity, face) {
    RSS(ref_dict_store(face_dict, face, 0), "store");
    each_ref_cavity_seg_node(ref_cavity, seg_node) {
      RSS(ref_dict_store(node_dict, ref_cavity_s2n(ref_cavity, seg_node, face),
                         0),
          "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"new-tri\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      seg = ref_dict_key(face_dict, item);
      RSS(ref_dict_location(node_dict, node, &local), "center node");
      fprintf(f, " %d", local + 1);
      each_ref_cavity_seg_node(ref_cavity, seg_node) {
        RSS(ref_dict_location(
                node_dict, ref_cavity_s2n(ref_cavity, seg_node, seg), &local),
            "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }

  RSS(ref_dict_free(face_dict), "free face");
  RSS(ref_dict_free(node_dict), "free nodes");
  fclose(f);

  return REF_SUCCESS;
}